

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

void * CallbackThreadFunc(void *userData)

{
  int iVar1;
  pthread_t pVar2;
  long lVar3;
  char *pcVar4;
  unsigned_long local_138;
  unsigned_long local_130;
  int *local_110;
  PaError *pres;
  unsigned_long uStack_100;
  int xrun;
  unsigned_long framesGot;
  unsigned_long framesAvail;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  snd_pcm_sframes_t avail;
  PaTime PStack_d8;
  int __not_first_call;
  void *__cancel_arg;
  PaStreamFinishedCallback *__cancel_routine;
  __pthread_unwind_buf_t __cancel_buf;
  ulong uStack_50;
  int streamStarted;
  PaStreamCallbackFlags cbFlags;
  ulong uStack_40;
  int callbackResult;
  snd_pcm_sframes_t startThreshold;
  PaStreamCallbackTimeInfo timeInfo;
  PaAlsaStream *stream;
  PaError result;
  void *userData_local;
  
  stream._4_4_ = 0;
  timeInfo.outputBufferDacTime = (PaTime)userData;
  memset(&startThreshold,0,0x18);
  uStack_40 = 0;
  cbFlags._4_4_ = 0;
  if (timeInfo.outputBufferDacTime == 0.0) {
    __assert_fail("stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1060,"void *CallbackThreadFunc(void *)");
  }
  if (*(int *)((long)timeInfo.outputBufferDacTime + 0x220) != 0) {
    __assert_fail("!stream->primeBuffers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x1062,"void *CallbackThreadFunc(void *)");
  }
  __cancel_arg = OnExit;
  PStack_d8 = timeInfo.outputBufferDacTime;
  avail._4_4_ = __sigsetjmp(&__cancel_routine,0);
  if (avail._4_4_ != 0) {
    (*(code *)__cancel_arg)(PStack_d8);
    __pthread_unwind_next((__pthread_unwind_buf_t *)&__cancel_routine);
  }
  __pthread_register_cancel((__pthread_unwind_buf_t *)&__cancel_routine);
  pthread_testcancel();
  pthread_setcancelstate(1,(int *)0x0);
  if (*(int *)((long)timeInfo.outputBufferDacTime + 0x220) == 0) {
    paUtilErr_ = PaUnixThread_PrepareNotify
                           ((PaUnixThread *)((long)timeInfo.outputBufferDacTime + 0x198));
    if (paUtilErr_ < 0) {
      PaUtil_DebugPrint(
                       "Expression \'PaUnixThread_PrepareNotify( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4226\n"
                       );
      stream._4_4_ = paUtilErr_;
    }
    else {
      paUtilErr_ = AlsaStart((PaAlsaStream *)timeInfo.outputBufferDacTime,0);
      if (paUtilErr_ < 0) {
        PaUtil_DebugPrint(
                         "Expression \'AlsaStart( stream, 0 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4228\n"
                         );
        stream._4_4_ = paUtilErr_;
      }
      else {
        paUtilErr_ = PaUnixThread_NotifyParent
                               ((PaUnixThread *)((long)timeInfo.outputBufferDacTime + 0x198));
        if (-1 < paUtilErr_) goto LAB_0011b3f4;
        PaUtil_DebugPrint(
                         "Expression \'PaUnixThread_NotifyParent( &stream->thread )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4229\n"
                         );
        stream._4_4_ = paUtilErr_;
      }
    }
  }
  else if ((*(long *)((long)timeInfo.outputBufferDacTime + 0x340) == 0) ||
          (framesAvail._4_4_ =
                (*(code *)alsa_snd_pcm_prepare)
                          (*(undefined8 *)((long)timeInfo.outputBufferDacTime + 0x340)),
          -1 < framesAvail._4_4_)) {
    if (((*(long *)((long)timeInfo.outputBufferDacTime + 0x2c0) == 0) ||
        (*(int *)((long)timeInfo.outputBufferDacTime + 0x228) != 0)) ||
       (framesAvail._0_4_ =
             (*(code *)alsa_snd_pcm_prepare)
                       (*(undefined8 *)((long)timeInfo.outputBufferDacTime + 0x2c0)),
       -1 < (int)framesAvail)) {
      ___pa_unsure_error_id_1 =
           (*alsa_snd_pcm_avail_update)(*(snd_pcm_t **)((long)timeInfo.outputBufferDacTime + 0x340))
      ;
      uStack_40 = ___pa_unsure_error_id_1 -
                  ___pa_unsure_error_id_1 % *(ulong *)((long)timeInfo.outputBufferDacTime + 0x348);
      if (uStack_40 < *(ulong *)((long)timeInfo.outputBufferDacTime + 0x348)) {
        __assert_fail("startThreshold >= stream->playback.framesPerPeriod",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x107e,"void *CallbackThreadFunc(void *)");
      }
LAB_0011b3f4:
      do {
        pres._4_4_ = 0;
        pthread_testcancel();
        iVar1 = PaUnixThread_StopRequested
                          ((PaUnixThread *)((long)timeInfo.outputBufferDacTime + 0x198));
        if ((iVar1 != 0) && (cbFlags._4_4_ == 0)) {
          cbFlags._4_4_ = 1;
        }
        if ((cbFlags._4_4_ != 0) &&
           ((*(uint *)((long)timeInfo.outputBufferDacTime + 0x240) = (uint)(cbFlags._4_4_ == 2),
            *(int *)((long)timeInfo.outputBufferDacTime + 0x240) != 0 ||
            (iVar1 = PaUtil_IsBufferProcessorOutputEmpty
                               ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68)
                               ), iVar1 != 0)))) goto LAB_0011b802;
        paUtilErr_ = PaAlsaStream_WaitForFrames
                               ((PaAlsaStream *)timeInfo.outputBufferDacTime,&framesGot,
                                (int *)((long)&pres + 4));
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4269\n"
                           );
          stream._4_4_ = paUtilErr_;
          goto LAB_0011b802;
        }
        if (pres._4_4_ == 0) {
          while (uStack_50 = 0, framesGot != 0) {
            pres._4_4_ = 0;
            if (0.0 < *(double *)((long)timeInfo.outputBufferDacTime + 0x278)) {
              uStack_50 = 4;
              *(undefined8 *)((long)timeInfo.outputBufferDacTime + 0x278) = 0;
            }
            if (0.0 < *(double *)((long)timeInfo.outputBufferDacTime + 0x280)) {
              uStack_50 = uStack_50 | 2;
              *(undefined8 *)((long)timeInfo.outputBufferDacTime + 0x280) = 0;
            }
            if ((*(long *)((long)timeInfo.outputBufferDacTime + 0x2c0) != 0) &&
               (*(long *)((long)timeInfo.outputBufferDacTime + 0x340) != 0)) {
              if (*(int *)((long)timeInfo.outputBufferDacTime + 0x2e0) == 0) {
                uStack_50 = uStack_50 | 1;
              }
              else if (*(int *)((long)timeInfo.outputBufferDacTime + 0x360) == 0) {
                uStack_50 = uStack_50 | 8;
              }
            }
            CalculateTimeInfo((PaAlsaStream *)timeInfo.outputBufferDacTime,
                              (PaStreamCallbackTimeInfo *)&startThreshold);
            PaUtil_BeginBufferProcessing
                      ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),
                       (PaStreamCallbackTimeInfo *)&startThreshold,uStack_50);
            PaUtil_BeginCpuLoadMeasurement
                      ((PaUtilCpuLoadMeasurer *)((long)timeInfo.outputBufferDacTime + 0x50));
            uStack_100 = framesGot;
            if (*(int *)((long)timeInfo.outputBufferDacTime + 0x78) == 0) {
              if (framesGot < *(ulong *)((long)timeInfo.outputBufferDacTime + 0x218)) {
                local_130 = 0;
              }
              else {
                local_130 = *(unsigned_long *)((long)timeInfo.outputBufferDacTime + 0x218);
              }
              uStack_100 = local_130;
            }
            else {
              if (*(int *)((long)timeInfo.outputBufferDacTime + 0x78) != 1) {
                __assert_fail("paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                              ,0x10f0,"void *CallbackThreadFunc(void *)");
              }
              if (framesGot < *(ulong *)((long)timeInfo.outputBufferDacTime + 0x218)) {
                local_138 = framesGot;
              }
              else {
                local_138 = *(unsigned_long *)((long)timeInfo.outputBufferDacTime + 0x218);
              }
              uStack_100 = local_138;
            }
            paUtilErr_ = PaAlsaStream_SetUpBuffers
                                   ((PaAlsaStream *)timeInfo.outputBufferDacTime,
                                    &stack0xffffffffffffff00,(int *)((long)&pres + 4));
            if (paUtilErr_ < 0) {
              PaUtil_DebugPrint(
                               "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4339\n"
                               );
              stream._4_4_ = paUtilErr_;
              goto LAB_0011b802;
            }
            framesGot = framesGot - uStack_100;
            if (uStack_100 != 0) {
              if (pres._4_4_ != 0) {
                __assert_fail("!xrun",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                              ,0x10f9,"void *CallbackThreadFunc(void *)");
              }
              PaUtil_EndBufferProcessing
                        ((PaUtilBufferProcessor *)((long)timeInfo.outputBufferDacTime + 0x68),
                         (int *)((long)&cbFlags + 4));
              paUtilErr_ = PaAlsaStream_EndProcessing
                                     ((PaAlsaStream *)timeInfo.outputBufferDacTime,uStack_100,
                                      (int *)((long)&pres + 4));
              if (paUtilErr_ < 0) {
                PaUtil_DebugPrint(
                                 "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4347\n"
                                 );
                stream._4_4_ = paUtilErr_;
                goto LAB_0011b802;
              }
            }
            PaUtil_EndCpuLoadMeasurement
                      ((PaUtilCpuLoadMeasurer *)((long)timeInfo.outputBufferDacTime + 0x50),
                       uStack_100);
            if ((uStack_100 == 0) || (cbFlags._4_4_ != 0)) break;
          }
        }
        else if (framesGot != 0) {
          __assert_fail("0 == framesAvail",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                        ,0x10b0,"void *CallbackThreadFunc(void *)");
        }
      } while( true );
    }
    pVar2 = pthread_self();
    iVar1 = pthread_equal(pVar2,paUnixMainThread);
    if (iVar1 != 0) {
      lVar3 = (long)(int)framesAvail;
      pcVar4 = (*alsa_snd_strerror)((int)framesAvail);
      PaUtil_SetLastHostErrorInfo(paALSA,lVar3,pcVar4);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_prepare( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4216\n"
                     );
    stream._4_4_ = -9999;
  }
  else {
    pVar2 = pthread_self();
    iVar1 = pthread_equal(pVar2,paUnixMainThread);
    if (iVar1 != 0) {
      lVar3 = (long)framesAvail._4_4_;
      pcVar4 = (*alsa_snd_strerror)(framesAvail._4_4_);
      PaUtil_SetLastHostErrorInfo(paALSA,lVar3,pcVar4);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_prepare( stream->playback.pcm )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/mixlr[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4214\n"
                     );
    stream._4_4_ = -9999;
  }
LAB_0011b802:
  __pthread_unregister_cancel((__pthread_unwind_buf_t *)&__cancel_routine);
  (*(code *)__cancel_arg)(PStack_d8);
  local_110 = (int *)0x0;
  if (stream._4_4_ != 0) {
    local_110 = (int *)malloc(4);
    *local_110 = stream._4_4_;
  }
  pthread_exit(local_110);
}

Assistant:

static void *CallbackThreadFunc( void *userData )
{
    PaError result = paNoError;
    PaAlsaStream *stream = (PaAlsaStream*) userData;
    PaStreamCallbackTimeInfo timeInfo = {0, 0, 0};
    snd_pcm_sframes_t startThreshold = 0;
    int callbackResult = paContinue;
    PaStreamCallbackFlags cbFlags = 0;  /* We might want to keep state across iterations */
    int streamStarted = 0;

    assert( stream );
    /* Not implemented */
    assert( !stream->primeBuffers );

    /* Execute OnExit when exiting */
    pthread_cleanup_push( &OnExit, stream );
#ifdef PTHREAD_CANCELED
    /* 'Abort' will use thread cancellation to terminate the callback thread, but the Alsa-lib functions
     * are NOT cancel-safe, (and can end up in an inconsistent state).  So, disable cancelability for
     * the thread here, and just re-enable it for the poll() in PaAlsaStream_WaitForFrames(). */
    pthread_testcancel();
    pthread_setcancelstate( PTHREAD_CANCEL_DISABLE, NULL );
#endif

    /* @concern StreamStart If the output is being primed the output pcm needs to be prepared, otherwise the
     * stream is started immediately. The latter involves signaling the waiting main thread.
     */
    if( stream->primeBuffers )
    {
        snd_pcm_sframes_t avail;

        if( stream->playback.pcm )
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
        if( stream->capture.pcm && !stream->pcmsSynced )
            ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );

        /* We can't be certain that the whole ring buffer is available for priming, but there should be
         * at least one period */
        avail = alsa_snd_pcm_avail_update( stream->playback.pcm );
        startThreshold = avail - (avail % stream->playback.framesPerPeriod);
        assert( startThreshold >= stream->playback.framesPerPeriod );
    }
    else
    {
        PA_ENSURE( PaUnixThread_PrepareNotify( &stream->thread ) );
        /* Buffer will be zeroed */
        PA_ENSURE( AlsaStart( stream, 0 ) );
        PA_ENSURE( PaUnixThread_NotifyParent( &stream->thread ) );

        streamStarted = 1;
    }

    while( 1 )
    {
        unsigned long framesAvail, framesGot;
        int xrun = 0;

#ifdef PTHREAD_CANCELED
        pthread_testcancel();
#endif

        /* @concern StreamStop if the main thread has requested a stop and the stream has not been effectively
         * stopped we signal this condition by modifying callbackResult (we'll want to flush buffered output).
         */
        if( PaUnixThread_StopRequested( &stream->thread ) && paContinue == callbackResult )
        {
            PA_DEBUG(( "Setting callbackResult to paComplete\n" ));
            callbackResult = paComplete;
        }

        if( paContinue != callbackResult )
        {
            stream->callbackAbort = ( paAbort == callbackResult );
            if( stream->callbackAbort ||
                    /** @concern BlockAdaption: Go on if adaption buffers are empty */
                    PaUtil_IsBufferProcessorOutputEmpty( &stream->bufferProcessor ) )
            {
                goto end;
            }

            PA_DEBUG(( "%s: Flushing buffer processor\n", __FUNCTION__ ));
            /* There is still buffered output that needs to be processed */
        }

        /* Wait for data to become available, this comes down to polling the ALSA file descriptors untill we have
         * a number of available frames.
         */
        PA_ENSURE( PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun ) );
        if( xrun )
        {
            assert( 0 == framesAvail );
            continue;

            /* XXX: Report xruns to the user? A situation is conceivable where the callback is never invoked due
             * to constant xruns, it might be desirable to notify the user of this.
             */
        }

        /* Consume buffer space. Once we have a number of frames available for consumption we must retrieve the
         * mmapped buffers from ALSA, this is contiguously accessible memory however, so we may receive smaller
         * portions at a time than is available as a whole. Therefore we should be prepared to process several
         * chunks successively. The buffers are passed to the PA buffer processor.
         */
        while( framesAvail > 0 )
        {
            xrun = 0;

            /** @concern Xruns Under/overflows are to be reported to the callback */
            if( stream->underrun > 0.0 )
            {
                cbFlags |= paOutputUnderflow;
                stream->underrun = 0.0;
            }
            if( stream->overrun > 0.0 )
            {
                cbFlags |= paInputOverflow;
                stream->overrun = 0.0;
            }
            if( stream->capture.pcm && stream->playback.pcm )
            {
                /** @concern FullDuplex It's possible that only one direction is being processed to avoid an
                 * under- or overflow, this should be reported correspondingly */
                if( !stream->capture.ready )
                {
                    cbFlags |= paInputUnderflow;
                    PA_DEBUG(( "%s: Input underflow\n", __FUNCTION__ ));
                }
                else if( !stream->playback.ready )
                {
                    cbFlags |= paOutputOverflow;
                    PA_DEBUG(( "%s: Output overflow\n", __FUNCTION__ ));
                }
            }

#if 0
            CallbackUpdate( &stream->threading );
#endif

            CalculateTimeInfo( stream, &timeInfo );
            PaUtil_BeginBufferProcessing( &stream->bufferProcessor, &timeInfo, cbFlags );
            cbFlags = 0;

            /* CPU load measurement should include processing activity external to the stream callback */
            PaUtil_BeginCpuLoadMeasurement( &stream->cpuLoadMeasurer );

            framesGot = framesAvail;
            if( paUtilFixedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode )
            {
                /* We've committed to a fixed host buffer size, stick to that */
                framesGot = framesGot >= stream->maxFramesPerHostBuffer ? stream->maxFramesPerHostBuffer : 0;
            }
            else
            {
                /* We've committed to an upper bound on the size of host buffers */
                assert( paUtilBoundedHostBufferSize == stream->bufferProcessor.hostBufferSizeMode );
                framesGot = PA_MIN( framesGot, stream->maxFramesPerHostBuffer );
            }
            PA_ENSURE( PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun ) );
            /* Check the host buffer size against the buffer processor configuration */
            framesAvail -= framesGot;

            if( framesGot > 0 )
            {
                assert( !xrun );
                PaUtil_EndBufferProcessing( &stream->bufferProcessor, &callbackResult );
                PA_ENSURE( PaAlsaStream_EndProcessing( stream, framesGot, &xrun ) );
            }
            PaUtil_EndCpuLoadMeasurement( &stream->cpuLoadMeasurer, framesGot );

            if( 0 == framesGot )
            {
                /* Go back to polling for more frames */
                break;
            }

            if( paContinue != callbackResult )
                break;
        }
    }

end:
    ; /* Hack to fix "label at end of compound statement" error caused by pthread_cleanup_pop(1) macro. */
    /* Match pthread_cleanup_push */
    pthread_cleanup_pop( 1 );

    PA_DEBUG(( "%s: Thread %d exiting\n ", __FUNCTION__, pthread_self() ));
    PaUnixThreading_EXIT( result );

error:
    PA_DEBUG(( "%s: Thread %d is canceled due to error %d\n ", __FUNCTION__, pthread_self(), result ));
    goto end;
}